

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_has(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSMapState *s;
  JSMapRecord *pJVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  JSValue key;
  
  s = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (s == (JSMapState *)0x0) {
    iVar4 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    JVar3 = (JSValueUnion)argv->tag;
    JVar2.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar3.float64 = 0.0;
      JVar2.float64 = 0.0;
    }
    key.tag = (int64_t)JVar3.ptr;
    key.u.ptr = JVar2.ptr;
    pJVar1 = map_find_record(ctx,s,key);
    JVar2._1_7_ = 0;
    JVar2.int32._0_1_ = pJVar1 != (JSMapRecord *)0x0;
    iVar4 = 1;
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_map_has(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    return JS_NewBool(ctx, (mr != NULL));
}